

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificTests.cc
# Opt level: O2

void avro::specific::testString(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string *this;
  string b;
  string n;
  char *local_68;
  char *local_60;
  const_string local_58;
  const_string local_48;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char *local_20;
  
  this = &b;
  std::__cxx11::string::string<std::allocator<char>>((string *)&n,"abc",(allocator<char> *)&b);
  encodeAndDecode<std::__cxx11::string>(&b,(specific *)&n,t);
  local_48.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SpecificTests.cc"
  ;
  local_48.m_end = "";
  local_58.m_begin = "";
  local_58.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_48,0x86,&local_58);
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_001cda40;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_20 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SpecificTests.cc"
  ;
  local_60 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_38,&local_68,0x86,1,2,&b,"b",&n,"n");
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&n);
  return;
}

Assistant:

void testString()
{
    string n = "abc";
    string b = encodeAndDecode(n);
    BOOST_CHECK_EQUAL(b, n);
}